

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzvec.h
# Opt level: O3

void __thiscall TPZVec<TPZPostProcVar>::~TPZVec(TPZVec<TPZPostProcVar> *this)

{
  long *plVar1;
  TPZPostProcVar *pTVar2;
  long lVar3;
  long *plVar4;
  long lVar5;
  
  this->_vptr_TPZVec = (_func_int **)&PTR__TPZVec_0197ef80;
  pTVar2 = this->fStore;
  if (pTVar2 != (TPZPostProcVar *)0x0) {
    lVar3 = pTVar2[-1].fNumEq;
    if (lVar3 != 0) {
      lVar5 = lVar3 * 0x38;
      do {
        plVar1 = (long *)((long)pTVar2 + lVar5 + -0x18);
        *(undefined ***)((long)&pTVar2[-1].super_TPZSavable._vptr_TPZSavable + lVar5) =
             &PTR__TPZPostProcVar_0197e398;
        plVar4 = *(long **)((long)pTVar2 + lVar5 + -0x28);
        if (plVar1 != plVar4) {
          operator_delete(plVar4,*plVar1 + 1);
        }
        lVar5 = lVar5 + -0x38;
      } while (lVar5 != 0);
    }
    operator_delete__(&pTVar2[-1].fNumEq,lVar3 * 0x38 + 8);
  }
  operator_delete(this,0x20);
  return;
}

Assistant:

inline TPZVec<T>::~TPZVec() {
	if( fStore )
	{
		delete [] fStore;
	}
}